

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

int Js::JavascriptString::IndexOfUsingJmpTable
              (Boyer_Moore_Jump *jmpTable,char16 *inputStr,charcount_t len,char16 *searchStr,
              int searchLen,int position)

{
  char16 cVar1;
  char16 cVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t count;
  char16 *pcVar6;
  
  cVar1 = searchStr[searchLen + -1];
  uVar4 = (ulong)jmpTable[(ushort)cVar1].shift;
  if (jmpTable[(ushort)cVar1].shift == 0) {
    uVar4 = (ulong)(uint)searchLen;
  }
  count = (size_t)searchLen;
  for (pcVar6 = inputStr + position + (count - 1); pcVar6 < inputStr + len; pcVar6 = pcVar6 + uVar5)
  {
    cVar2 = *pcVar6;
    if (cVar2 == cVar1) {
      iVar3 = PAL_wmemcmp(pcVar6 + (1 - count),searchStr,count);
      uVar5 = uVar4;
      if (iVar3 == 0) break;
    }
    else {
      uVar5 = count;
      if (((ushort)cVar2 < 0x80) &&
         (uVar5 = (ulong)jmpTable[(ushort)cVar2].shift, (ulong)jmpTable[(ushort)cVar2].shift == 0))
      {
        uVar5 = count;
      }
    }
  }
  iVar3 = ((int)((ulong)((long)pcVar6 - (long)inputStr) >> 1) - searchLen) + 1;
  if (inputStr + len <= pcVar6) {
    iVar3 = -1;
  }
  if (pcVar6 < inputStr + position) {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int JavascriptString::IndexOfUsingJmpTable(JmpTable jmpTable, const char16* inputStr, charcount_t len, const char16* searchStr, int searchLen, int position)
    {
        int result = -1;

        const char16 searchLast = searchStr[searchLen-1];

        uint32 lMatchedJump = searchLen;
        if (jmpTable[searchLast].shift > 0)
        {
            lMatchedJump = jmpTable[searchLast].shift;
        }

        char16 const * p = inputStr + position + searchLen-1;
        WCHAR c;
        while(p < inputStr + len)
        {
            // first character match, keep checking
            if (*p == searchLast)
            {
                if ( wmemcmp(p-searchLen+1, searchStr, searchLen) == 0 )
                {
                    break;
                }
                p += lMatchedJump;
            }
            else
            {
                c = *p;
                if ( 0 == ( c & ~0x7f ) && jmpTable[c].shift != 0 )
                {
                    p += jmpTable[c].shift;
                }
                else
                {
                    p += searchLen;
                }
            }
        }

        if (p >= inputStr+position && p < inputStr + len)
        {
            result = (int)(p - inputStr) - searchLen + 1;
        }

        return result;
    }